

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O3

FT_ULong FT_Stream_ReadUOffset(FT_Stream stream,FT_Error *error)

{
  unsigned_long uVar1;
  FT_ULong FVar2;
  FT_Error FVar3;
  byte *pbVar4;
  FT_Byte reads [3];
  byte local_23 [3];
  
  uVar1 = stream->pos;
  FVar3 = 0x55;
  if (stream->size <= uVar1 + 2) {
LAB_00218369:
    FVar2 = 0;
    goto LAB_0021839f;
  }
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->base != (uchar *)0x0) {
      pbVar4 = stream->base + uVar1;
      goto LAB_00218378;
    }
    FVar2 = 0;
  }
  else {
    pbVar4 = local_23;
    uVar1 = (*stream->read)(stream,uVar1,pbVar4,3);
    if (uVar1 != 3) goto LAB_00218369;
    uVar1 = stream->pos;
LAB_00218378:
    FVar2 = (ulong)pbVar4[2] | (ulong)((uint)pbVar4[1] << 8 | (uint)*pbVar4 << 0x10);
  }
  stream->pos = uVar1 + 3;
  FVar3 = 0;
LAB_0021839f:
  *error = FVar3;
  return FVar2;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_ReadUOffset( FT_Stream  stream,
                         FT_Error*  error )
  {
    FT_Byte   reads[3];
    FT_Byte*  p;
    FT_ULong  result = 0;


    FT_ASSERT( stream );

    if ( stream->pos + 2 < stream->size )
    {
      if ( stream->read )
      {
        if (stream->read( stream, stream->pos, reads, 3L ) != 3L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_UOFF3( p );
    }
    else
      goto Fail;

    stream->pos += 3;

    *error = FT_Err_Ok;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadUOffset:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return result;
  }